

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdFlag.c
# Opt level: O0

void Cmd_FlagDeleteByName(Abc_Frame_t *pAbc,char *key)

{
  int iVar1;
  char *local_20;
  char *value;
  char *key_local;
  Abc_Frame_t *pAbc_local;
  
  if ((key != (char *)0x0) &&
     (value = key, key_local = (char *)pAbc, iVar1 = st__delete(pAbc->tFlags,&value,&local_20),
     iVar1 != 0)) {
    if (value != (char *)0x0) {
      free(value);
      value = (char *)0x0;
    }
    if (local_20 != (char *)0x0) {
      free(local_20);
    }
  }
  return;
}

Assistant:

void Cmd_FlagDeleteByName( Abc_Frame_t * pAbc, const char * key )
{
    char *value;
    if ( !key )
        return;
    if ( st__delete( pAbc->tFlags, &key, &value ) ) 
    {
        ABC_FREE(key);
        ABC_FREE(value);
    }
}